

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestcompareArray::runTestCase(TestValueTestcompareArray *this)

{
  TestResult *pTVar1;
  ValueHolder local_138;
  char *local_130;
  undefined4 local_128;
  char *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  Value local_108;
  Value l2bArray;
  Value l2aArray;
  Value l1aArray;
  Value emptyArray;
  Value l1bArray;
  
  Json::Value::Value(&emptyArray,arrayValue);
  Json::Value::Value(&l1aArray,nullValue);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&l1aArray,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value(&l1bArray,nullValue);
  Json::Value::Value((Value *)&local_138,10);
  Json::Value::append(&l1bArray,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value(&l2aArray,nullValue);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&l2aArray,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&l2aArray,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value(&l2bArray,nullValue);
  Json::Value::Value((Value *)&local_138,0);
  Json::Value::append(&l2bArray,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  Json::Value::Value((Value *)&local_138,10);
  Json::Value::append(&l2bArray,(Value *)&local_138);
  Json::Value::~Value((Value *)&local_138);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x588;
  local_120 = "checkIsLess(emptyArray, l1aArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&emptyArray,&l1aArray);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x589;
  local_120 = "checkIsLess(emptyArray, l2aArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&emptyArray,&l2aArray);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58a;
  local_120 = "checkIsLess(l1aArray, l2aArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&l1aArray,&l2aArray);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58b;
  local_120 = "checkIsLess(l2aArray, l2bArray)";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  ValueTest::checkIsLess(&this->super_ValueTest,&l2aArray,&l2bArray);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58c;
  local_120 = "checkIsEqual(emptyArray, Json::Value(emptyArray))";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  Json::Value::Value(&local_108,&emptyArray);
  ValueTest::checkIsEqual(&this->super_ValueTest,&emptyArray,&local_108);
  Json::Value::~Value(&local_108);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58d;
  local_120 = "checkIsEqual(l1aArray, Json::Value(l1aArray))";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  Json::Value::Value(&local_108,&l1aArray);
  ValueTest::checkIsEqual(&this->super_ValueTest,&l1aArray,&local_108);
  Json::Value::~Value(&local_108);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_138.int_._0_4_ = pTVar1->predicateId_;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x58e;
  local_120 = "checkIsEqual(l2bArray, Json::Value(l2bArray))";
  local_118 = 0;
  uStack_110 = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&local_138;
  pTVar1->predicateId_ = local_138.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&local_138;
  Json::Value::Value(&local_108,&l2bArray);
  ValueTest::checkIsEqual(&this->super_ValueTest,&l2bArray,&local_108);
  Json::Value::~Value(&local_108);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  Json::Value::~Value(&l2bArray);
  Json::Value::~Value(&l2aArray);
  Json::Value::~Value(&l1bArray);
  Json::Value::~Value(&l1aArray);
  Json::Value::~Value(&emptyArray);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, compareArray) {
  // array compare size then content
  Json::Value emptyArray(Json::arrayValue);
  Json::Value l1aArray;
  l1aArray.append(0);
  Json::Value l1bArray;
  l1bArray.append(10);
  Json::Value l2aArray;
  l2aArray.append(0);
  l2aArray.append(0);
  Json::Value l2bArray;
  l2bArray.append(0);
  l2bArray.append(10);
  JSONTEST_ASSERT_PRED(checkIsLess(emptyArray, l1aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(emptyArray, l2aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(l1aArray, l2aArray));
  JSONTEST_ASSERT_PRED(checkIsLess(l2aArray, l2bArray));
  JSONTEST_ASSERT_PRED(checkIsEqual(emptyArray, Json::Value(emptyArray)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l1aArray, Json::Value(l1aArray)));
  JSONTEST_ASSERT_PRED(checkIsEqual(l2bArray, Json::Value(l2bArray)));
}